

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_entry_finalize(zip_t *zip,zip_entry_mark_t *entry_mark,size_t n)

{
  long lVar1;
  long *__ptr;
  ulong uVar2;
  long *__ptr_00;
  ulong uVar3;
  long lVar4;
  int iVar5;
  zip_entry_mark_t *pzVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  __ptr = (long *)calloc(n,8);
  if (__ptr == (long *)0x0) {
    return -0x15;
  }
  if (n != 0) {
    uVar2 = 0;
    do {
      uVar9 = entry_mark[uVar2].m_local_header_ofs;
      __ptr[uVar2] = uVar9;
      uVar8 = uVar2;
      do {
        uVar3 = uVar8;
        if ((long)uVar3 < 1) {
          uVar3 = 0;
          break;
        }
        uVar8 = uVar3 - 1;
      } while (uVar9 <= (ulong)__ptr[uVar3 - 1]);
      if (uVar3 != uVar2) {
        uVar8 = uVar2;
        if (uVar3 < uVar2) {
          do {
            __ptr[uVar8] = __ptr[uVar8 - 1];
            uVar8 = uVar8 - 1;
          } while ((long)uVar3 < (long)uVar8);
        }
        __ptr[uVar3] = uVar9;
        pzVar6 = entry_mark;
        for (uVar9 = uVar2; uVar9 != 0; uVar9 = uVar9 - 1) {
          if ((long)uVar3 <= pzVar6->file_index) {
            pzVar6->file_index = pzVar6->file_index + 1;
          }
          pzVar6 = pzVar6 + 1;
        }
        entry_mark[uVar3].file_index = uVar2;
      }
      entry_mark[uVar2].file_index = uVar3;
      uVar2 = uVar2 + 1;
    } while (uVar2 != n);
  }
  __ptr_00 = (long *)calloc(n,8);
  if (__ptr_00 == (long *)0x0) {
    iVar5 = -0x15;
    goto LAB_00114a6b;
  }
  if (n == 1) {
    *__ptr_00 = (zip->archive).m_archive_size - *__ptr;
LAB_00114a4d:
    do {
      entry_mark->lf_length = __ptr_00[entry_mark->file_index];
      entry_mark = entry_mark + 1;
      n = n - 1;
    } while (n != 0);
  }
  else {
    lVar7 = 0;
    lVar4 = *__ptr;
    do {
      lVar1 = __ptr[lVar7 + 1];
      __ptr_00[lVar7] = lVar1 - lVar4;
      lVar7 = lVar7 + 1;
      lVar4 = lVar1;
    } while (n - 1 != lVar7);
    __ptr_00[n - 1] = (zip->archive).m_archive_size - __ptr[n - 1];
    if (n != 0) goto LAB_00114a4d;
  }
  free(__ptr_00);
  iVar5 = 0;
LAB_00114a6b:
  free(__ptr);
  return iVar5;
}

Assistant:

static int zip_entry_finalize(struct zip_t *zip,
                              struct zip_entry_mark_t *entry_mark,
                              const size_t n) {
  size_t i = 0;
  mz_uint64 *local_header_ofs_array = (mz_uint64 *)calloc(n, sizeof(mz_uint64));
  if (!local_header_ofs_array) {
    return ZIP_EOOMEM;
  }

  for (i = 0; i < n; ++i) {
    local_header_ofs_array[i] = entry_mark[i].m_local_header_ofs;
    ssize_t index = zip_sort(local_header_ofs_array, i);

    if ((size_t)index != i) {
      zip_index_update(entry_mark, i, index);
    }
    entry_mark[i].file_index = index;
  }

  size_t *length = (size_t *)calloc(n, sizeof(size_t));
  if (!length) {
    CLEANUP(local_header_ofs_array);
    return ZIP_EOOMEM;
  }
  for (i = 0; i < n - 1; i++) {
    length[i] =
        (size_t)(local_header_ofs_array[i + 1] - local_header_ofs_array[i]);
  }
  length[n - 1] =
      (size_t)(zip->archive.m_archive_size - local_header_ofs_array[n - 1]);

  for (i = 0; i < n; i++) {
    entry_mark[i].lf_length = length[entry_mark[i].file_index];
  }

  CLEANUP(length);
  CLEANUP(local_header_ofs_array);
  return 0;
}